

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_hardlink.c
# Opt level: O1

void test_write_disk_hardlink(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *a;
  archive_entry *paVar3;
  la_ssize_t lVar4;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                  ,L'9',L'\x12');
  a = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'<',(uint)(a != (archive *)0x0),"(ad = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'D',(uint)(paVar3 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar3,"link1a");
  archive_entry_set_mode(paVar3,0x81ed);
  archive_entry_set_size(paVar3,0x1b);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'H',0,"0",(long)iVar1,"archive_write_header(ad, ae)",a);
  lVar4 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'J',0x1b,"sizeof(data)",lVar4,"archive_write_data(ad, data, sizeof(data))",
                      (void *)0x0);
  iVar1 = archive_write_finish_entry(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'K',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'O',(uint)(paVar3 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar3,"link1b");
  archive_entry_set_mode(paVar3,0x81a2);
  archive_entry_set_size(paVar3,0);
  archive_entry_copy_hardlink(paVar3,"link1a");
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'T',0,"0",(long)iVar1,"r = archive_write_header(ad, ae)",a);
  if (-0x15 < iVar1) {
    lVar4 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L'W',-0x14,"ARCHIVE_WARN",lVar4,
                        "archive_write_data(ad, data, sizeof(data))",(void *)0x0);
    iVar1 = archive_write_finish_entry(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L'X',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  }
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'b',(uint)(paVar3 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar3,"link2a");
  archive_entry_set_mode(paVar3,0x81ed);
  archive_entry_set_size(paVar3,0x1b);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'f',0,"0",(long)iVar1,"archive_write_header(ad, ae)",a);
  lVar4 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'h',0x1b,"sizeof(data)",lVar4,"archive_write_data(ad, data, sizeof(data))",
                      (void *)0x0);
  iVar1 = archive_write_finish_entry(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'i',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'm',(uint)(paVar3 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar3,"link2b");
  archive_entry_set_mode(paVar3,0x81a2);
  archive_entry_unset_size(paVar3);
  archive_entry_copy_hardlink(paVar3,"link2a");
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'r',0,"0",(long)iVar1,"r = archive_write_header(ad, ae)",a);
  if (-0x15 < iVar1) {
    lVar4 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L'u',-0x14,"ARCHIVE_WARN",lVar4,
                        "archive_write_data(ad, data, sizeof(data))",(void *)0x0);
    iVar1 = archive_write_finish_entry(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L'v',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  }
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'\x80',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar3,"link3a");
  archive_entry_set_mode(paVar3,0x8180);
  archive_entry_set_size(paVar3,0x1b);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'\x84',0,"0",(long)iVar1,"archive_write_header(ad, ae)",a);
  lVar4 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'\x85',0x1b,"sizeof(data)",lVar4,
                      "archive_write_data(ad, data, sizeof(data))",(void *)0x0);
  iVar1 = archive_write_finish_entry(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'\x86',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'\x8a',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar3,"link3b");
  archive_entry_set_mode(paVar3,0x81ed);
  archive_entry_set_size(paVar3,0x1b);
  archive_entry_copy_hardlink(paVar3,"link3a");
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'\x8f',0,"0",(long)iVar1,"r = archive_write_header(ad, ae)",a);
  if (-0x14 < iVar1) {
    lVar4 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L'\x92',0x1b,"sizeof(data)",lVar4,
                        "archive_write_data(ad, data, sizeof(data))",(void *)0x0);
    iVar1 = archive_write_finish_entry(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L'\x93',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  }
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'\x9d',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar3,"link4a");
  archive_entry_set_mode(paVar3,0x8180);
  archive_entry_set_size(paVar3,0);
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'¡',0,"0",(long)iVar1,"archive_write_header(ad, ae)",a);
  lVar4 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'¢',-0x14,"ARCHIVE_WARN",lVar4,"archive_write_data(ad, data, 1)",
                      (void *)0x0);
  iVar1 = archive_write_finish_entry(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'£',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'§',(uint)(paVar3 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar3,"link4b");
  archive_entry_set_mode(paVar3,0x81ed);
  archive_entry_set_size(paVar3,0x1b);
  archive_entry_copy_hardlink(paVar3,"link4a");
  iVar1 = archive_write_header(a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'¬',0,"0",(long)iVar1,"r = archive_write_header(ad, ae)",a);
  if (-0x19 < iVar1) {
    lVar4 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L'¯',0x1b,"sizeof(data)",lVar4,
                        "archive_write_data(ad, data, sizeof(data))",(void *)0x0);
    iVar1 = archive_write_finish_entry(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L'°',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  }
  archive_entry_free(paVar3);
  wVar2 = canSymlink();
  if (wVar2 != L'\0') {
    paVar3 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                     ,L'¹',(uint)(paVar3 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar3,"link5a");
    archive_entry_set_mode(paVar3,0xa1a2);
    archive_entry_unset_size(paVar3);
    archive_entry_copy_symlink(paVar3,"foo");
    iVar1 = archive_write_header(a,paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L'¾',0,"0",(long)iVar1,"r = archive_write_header(ad, ae)",a);
    if (-0x15 < iVar1) {
      lVar4 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                          ,L'Á',-0x14,"ARCHIVE_WARN",lVar4,
                          "archive_write_data(ad, data, sizeof(data))",(void *)0x0);
      iVar1 = archive_write_finish_entry(a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                          ,L'Â',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
    }
    archive_entry_free(paVar3);
    paVar3 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                     ,L'È',(uint)(paVar3 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar3,"link5b");
    archive_entry_set_mode(paVar3,0x81a2);
    archive_entry_set_size(paVar3,0);
    archive_entry_copy_hardlink(paVar3,"link5a");
    iVar1 = archive_write_header(a,paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L'Í',0,"0",(long)iVar1,"r = archive_write_header(ad, ae)",a);
    if (-0x15 < iVar1) {
      lVar4 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                          ,L'Ð',-0x14,"ARCHIVE_WARN",lVar4,
                          "archive_write_data(ad, data, sizeof(data))",(void *)0x0);
      iVar1 = archive_write_finish_entry(a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                          ,L'Ñ',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
    }
    archive_entry_free(paVar3);
  }
  iVar1 = archive_write_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'Ö',0,"0",(long)iVar1,"archive_write_free(ad)",(void *)0x0);
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'ß',"link1a",L'ǭ');
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'à',"link1a",0x1b);
  assertion_file_nlinks
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
             ,L'á',"link1a",L'\x02');
  assertion_is_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
             ,L'â',"link1a","link1b");
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'ë',"link2a",L'ǭ');
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'ì',"link2a",0x1b);
  assertion_file_nlinks
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
             ,L'í',"link2a",L'\x02');
  assertion_is_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
             ,L'î',"link2a","link2b");
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'ñ',"link3a",L'ǭ');
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'ò',"link3a",0x1b);
  assertion_file_nlinks
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
             ,L'ó',"link3a",L'\x02');
  assertion_is_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
             ,L'ô',"link3a","link3b");
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'÷',"link4a",L'ǭ');
  assertion_file_nlinks
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
             ,L'ø',"link4a",L'\x02');
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'ù',"link4a",0x1b);
  assertion_is_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
             ,L'ú',"link4a","link4b");
  if (wVar2 != L'\0') {
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
               ,L'ÿ',"link5a","foo",L'\0');
    assertion_file_nlinks
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
               ,L'Ā',"link5a",L'\x02');
    assertion_is_hardlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
               ,L'ā',"link5a","link5b");
    return;
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_hardlink)
{
#if defined(__HAIKU__)
	skipping("archive_write_disk_hardlink; hardlinks are not supported on bfs");
#else
	static const char data[]="abcdefghijklmnopqrstuvwxyz";
	struct archive *ad;
	struct archive_entry *ae;
#ifdef HAVE_LINKAT
	int can_symlink;
#endif
	int r;

	/* Force the umask to something predictable. */
	assertUmask(UMASK);

	/* Write entries to disk. */
	assert((ad = archive_write_disk_new()) != NULL);

	/*
	 * First, use a tar-like approach; a regular file, then
	 * a separate "hardlink" entry.
	 */

	/* Regular file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link1a");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, sizeof(data));
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(sizeof(data),
	    archive_write_data(ad, data, sizeof(data)));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/* Link.  Size of zero means this doesn't carry data. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link1b");
	archive_entry_set_mode(ae, S_IFREG | 0642);
	archive_entry_set_size(ae, 0);
	archive_entry_copy_hardlink(ae, "link1a");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r >= ARCHIVE_WARN) {
		assertEqualInt(ARCHIVE_WARN,
		    archive_write_data(ad, data, sizeof(data)));
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	}
	archive_entry_free(ae);

	/*
	 * Repeat tar approach test, but use unset to mark the
	 * hardlink as having no data.
	 */

	/* Regular file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link2a");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, sizeof(data));
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(sizeof(data),
	    archive_write_data(ad, data, sizeof(data)));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/* Link.  Unset size means this doesn't carry data. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link2b");
	archive_entry_set_mode(ae, S_IFREG | 0642);
	archive_entry_unset_size(ae);
	archive_entry_copy_hardlink(ae, "link2a");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r >= ARCHIVE_WARN) {
		assertEqualInt(ARCHIVE_WARN,
		    archive_write_data(ad, data, sizeof(data)));
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	}
	archive_entry_free(ae);

	/*
	 * Second, try an old-cpio-like approach; a regular file, then
	 * another identical one (which has been marked hardlink).
	 */

	/* Regular file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link3a");
	archive_entry_set_mode(ae, S_IFREG | 0600);
	archive_entry_set_size(ae, sizeof(data));
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(sizeof(data), archive_write_data(ad, data, sizeof(data)));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/* Link. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link3b");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, sizeof(data));
	archive_entry_copy_hardlink(ae, "link3a");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r > ARCHIVE_WARN) {
		assertEqualInt(sizeof(data),
		    archive_write_data(ad, data, sizeof(data)));
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	}
	archive_entry_free(ae);

	/*
	 * Third, try a new-cpio-like approach, where the initial
	 * regular file is empty and the hardlink has the data.
	 */

	/* Regular file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link4a");
	archive_entry_set_mode(ae, S_IFREG | 0600);
	archive_entry_set_size(ae, 0);
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(ARCHIVE_WARN, archive_write_data(ad, data, 1));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/* Link. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link4b");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, sizeof(data));
	archive_entry_copy_hardlink(ae, "link4a");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r > ARCHIVE_FAILED) {
		assertEqualInt(sizeof(data),
		    archive_write_data(ad, data, sizeof(data)));
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	}
	archive_entry_free(ae);

#ifdef HAVE_LINKAT
	/* Finally, try creating a hard link to a dangling symlink */
	can_symlink = canSymlink();
	if (can_symlink) {
		/* Symbolic link: link5a -> foo */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, "link5a");
		archive_entry_set_mode(ae, AE_IFLNK | 0642);
		archive_entry_unset_size(ae);
		archive_entry_copy_symlink(ae, "foo");
		assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
		if (r >= ARCHIVE_WARN) {
			assertEqualInt(ARCHIVE_WARN,
			    archive_write_data(ad, data, sizeof(data)));
			assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
		}
		archive_entry_free(ae);


		/* Link.  Size of zero means this doesn't carry data. */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, "link5b");
		archive_entry_set_mode(ae, S_IFREG | 0642);
		archive_entry_set_size(ae, 0);
		archive_entry_copy_hardlink(ae, "link5a");
		assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
		if (r >= ARCHIVE_WARN) {
			assertEqualInt(ARCHIVE_WARN,
			    archive_write_data(ad, data, sizeof(data)));
			assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
		}
		archive_entry_free(ae);
	}
#endif
	assertEqualInt(0, archive_write_free(ad));

	/* Test the entries on disk. */

	/* Test #1 */
	/* If the hardlink was successfully created and the archive
	 * doesn't carry data for it, we consider it to be
	 * non-authoritative for meta data as well.  This is consistent
	 * with GNU tar and BSD pax.  */
	assertIsReg("link1a", 0755 & ~UMASK);
	assertFileSize("link1a", sizeof(data));
	assertFileNLinks("link1a", 2);
	assertIsHardlink("link1a", "link1b");

	/* Test #2: Should produce identical results to test #1 */
	/* Note that marking a hardlink with size = 0 is treated the
	 * same as having an unset size.  This is partly for backwards
	 * compatibility (we used to not have unset tracking, so
	 * relied on size == 0) and partly to match the model used by
	 * common file formats that store a size of zero for
	 * hardlinks. */
	assertIsReg("link2a", 0755 & ~UMASK);
	assertFileSize("link2a", sizeof(data));
	assertFileNLinks("link2a", 2);
	assertIsHardlink("link2a", "link2b");

	/* Test #3 */
	assertIsReg("link3a", 0755 & ~UMASK);
	assertFileSize("link3a", sizeof(data));
	assertFileNLinks("link3a", 2);
	assertIsHardlink("link3a", "link3b");

	/* Test #4 */
	assertIsReg("link4a", 0755 & ~UMASK);
	assertFileNLinks("link4a", 2);
	assertFileSize("link4a", sizeof(data));
	assertIsHardlink("link4a", "link4b");

#ifdef HAVE_LINKAT
	if (can_symlink) {
		/* Test #5 */
		assertIsSymlink("link5a", "foo", 0);
		assertFileNLinks("link5a", 2);
		assertIsHardlink("link5a", "link5b");
	}
#endif
#endif
}